

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O2

void __thiscall
DatUnpacker::DatFile::setItems
          (DatFile *this,
          vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *value)

{
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *pvVar1;
  pointer ppDVar2;
  long lVar3;
  
  pvVar1 = this->_items;
  if (pvVar1 != (vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *)
                0x0) {
    ppDVar2 = pvVar1[-1].
              super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppDVar2 != (pointer)0x0) {
      lVar3 = (long)ppDVar2 * 0x18;
      do {
        std::_Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>::
        ~_Vector_base((_Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                       *)((long)&pvVar1[-1].
                                 super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    operator_delete__(&pvVar1[-1].
                       super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppDVar2 * 0x18 + 8);
  }
  this->_items = value;
  return;
}

Assistant:

void DatFile::setItems(std::vector<DatFileItem*>* value)
    {
        delete [] _items;
        _items = value;
    }